

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O0

void helicsFederateRequestTimeAsync(HelicsFederate fed,HelicsTime requestTime,HelicsError *err)

{
  Federate *this;
  Federate *fedObj;
  Federate *in_stack_00000048;
  Time in_stack_00000050;
  double in_stack_ffffffffffffffb8;
  HelicsError *in_stack_ffffffffffffffc8;
  HelicsFederate in_stack_ffffffffffffffd0;
  
  this = getFed(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  if (this != (Federate *)0x0) {
    TimeRepresentation<count_time<9,_long>_>::TimeRepresentation
              ((TimeRepresentation<count_time<9,_long>_> *)this,in_stack_ffffffffffffffb8);
    helics::Federate::requestTimeAsync(in_stack_00000048,in_stack_00000050);
  }
  return;
}

Assistant:

void helicsFederateRequestTimeAsync(HelicsFederate fed, HelicsTime requestTime, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return;
    }
    try {
        fedObj->requestTimeAsync(requestTime);
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}